

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

void prepare_keyvalue(char *keyvalue)

{
  int iVar1;
  size_t sVar2;
  char *in_RDI;
  bool bVar3;
  int length;
  int i;
  int local_c;
  
  sVar2 = strlen(in_RDI);
  iVar1 = (int)sVar2;
  if ((*in_RDI == '\'') && (in_RDI[iVar1 + -1] == '\'')) {
    for (local_c = 0; local_c < iVar1 + -2; local_c = local_c + 1) {
      in_RDI[local_c] = in_RDI[local_c + 1];
    }
    in_RDI[iVar1 + -2] = '\0';
  }
  sVar2 = strlen(in_RDI);
  iVar1 = (int)sVar2 + -1;
  local_c = 0;
  while( true ) {
    bVar3 = false;
    if (local_c < iVar1) {
      bVar3 = in_RDI[local_c] == ' ';
    }
    if (!bVar3) break;
    local_c = local_c + 1;
  }
  bVar3 = local_c != iVar1;
  local_c = iVar1;
  if (bVar3) {
    while( true ) {
      bVar3 = false;
      if (-1 < local_c) {
        bVar3 = in_RDI[local_c] == ' ';
      }
      if (!bVar3) break;
      in_RDI[local_c] = '\0';
      local_c = local_c + -1;
    }
  }
  return;
}

Assistant:

void prepare_keyvalue(char *keyvalue) /* string containing keyword value     */

/*
  strip off all single quote characters "'" and blank spaces from a keyword
  value retrieved via fits_read_key*() routines

  this is necessary so that a standard comparision of keyword values may
  be made
*/

{

  int i;
  int length;

  /*
    strip off any leading or trailing single quotes (`) and (') from
    the keyword value
  */

  length = strlen(keyvalue) - 1;

  if(keyvalue[0] == '\'' && keyvalue[length] == '\'')
    {
      for(i = 0; i < length - 1; ++i) keyvalue[i] = keyvalue[i+1];
      keyvalue[length-1] = 0;
    }
  
  /*
    strip off any trailing blanks from the keyword value; note that if the
    keyvalue consists of nothing but blanks then no blanks are stripped
  */

  length = strlen(keyvalue) - 1;

  for(i = 0; i < length && keyvalue[i] == ' '; ++i);

  if(i != length)
    {
      for(i = length; i >= 0 && keyvalue[i] == ' '; --i) keyvalue[i] = '\0';
    }
}